

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_merge_parent_children(lyd_node *target,lyd_node *source,int options)

{
  LYS_NODE LVar1;
  ly_ctx *ctx;
  int iVar2;
  LY_ERR *pLVar3;
  lyd_node *unaff_RBX;
  lyd_node *plVar4;
  lyd_node *node1;
  lyd_node *node2;
  lyd_node *plVar5;
  lyd_node *plVar6;
  bool bVar7;
  lyd_node *local_58;
  lyd_node *local_48;
  
  ctx = target->schema->module->ctx;
  local_48 = source;
  do {
    plVar4 = source;
    if (plVar4 == (lyd_node *)0x0) {
      iVar2 = 0;
LAB_0015f996:
      lyd_free_withsiblings(local_48);
      return iVar2;
    }
    source = plVar4->next;
    node2 = plVar4;
    plVar6 = target;
    do {
      if ((((uint)options >> 8 & 1) == 0) || ((node2->field_0x9 & 1) == 0)) {
        for (node1 = plVar6->child; node1 != (lyd_node *)0x0; node1 = node1->next) {
          iVar2 = lyd_merge_node_equal(node1,node2);
          if (iVar2 != 0) {
            if ((node1->schema->nodetype & (LYS_ANYDATA|LYS_LEAF)) != LYS_UNKNOWN) {
              lyd_merge_node_update(node1,node2);
            }
            break;
          }
          pLVar3 = ly_errno_location();
          if (*pLVar3 != LY_SUCCESS) {
            return 1;
          }
        }
        unaff_RBX = node2;
        local_58 = plVar6;
        if (((node2->schema->nodetype & (LYS_LIST|LYS_CONTAINER)) == LYS_UNKNOWN) ||
           (plVar5 = node2->child, node1 == (lyd_node *)0x0 || plVar5 == (lyd_node *)0x0))
        goto LAB_0015f886;
        bVar7 = false;
LAB_0015f898:
        if (plVar5 == (lyd_node *)0x0) {
          do {
            node2 = node2->parent;
            if (node2->parent == plVar4->parent) break;
            plVar5 = node2->next;
            node1 = node1->parent;
          } while (plVar5 == (lyd_node *)0x0);
        }
        plVar6 = node1;
        if (bVar7) goto LAB_0015f8c8;
      }
      else {
        node1 = (lyd_node *)&DAT_00000001;
        if (node2 == plVar4) break;
LAB_0015f886:
        if (node2 != plVar4) {
          plVar5 = node2->next;
          bVar7 = node1 == (lyd_node *)0x0;
          node1 = plVar6;
          goto LAB_0015f898;
        }
        LVar1 = node2->schema->nodetype;
        if ((LVar1 == LYS_CONTAINER) ||
           ((node1 != (lyd_node *)0x0 && ((LVar1 & (LYS_ANYDATA|LYS_LEAF)) != LYS_UNKNOWN)))) break;
        plVar5 = (lyd_node *)0x0;
LAB_0015f8c8:
        if (ctx == unaff_RBX->schema->module->ctx) {
          lyd_unlink_internal(unaff_RBX,1);
        }
        else {
          unaff_RBX = lyd_dup_to_ctx(unaff_RBX,1,ctx);
        }
        iVar2 = lyd_insert(local_58,unaff_RBX);
        if (iVar2 != 0) {
          pLVar3 = ly_errno_location();
          *pLVar3 = LY_EINT;
          ly_log(LY_LLERR,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                 ,0x804);
          iVar2 = 1;
          goto LAB_0015f996;
        }
        if (node2 == plVar4) {
          if (local_48 == plVar4) {
            local_48 = local_48->next;
          }
          break;
        }
      }
      node2 = plVar5;
    } while (node2 != (lyd_node *)0x0);
  } while( true );
}

Assistant:

static int
lyd_merge_parent_children(struct lyd_node *target, struct lyd_node *source, int options)
{
    struct lyd_node *trg_parent, *src, *src_backup, *src_elem, *src_elem_backup, *src_next, *trg_child, *trg_parent_backup;
    struct ly_ctx *ctx = target->schema->module->ctx; /* shortcut */

    LY_TREE_FOR_SAFE(source, src_backup, src) {
        for (src_elem = src_next = src, trg_parent = target;
            src_elem;
            src_elem = src_next) {

            /* it won't get inserted in this case */
            if (src_elem->dflt && (options & LYD_OPT_EXPLICIT)) {
                if (src_elem == src) {
                    /* we are done with this subtree in this case */
                    break;
                }
                trg_child = (struct lyd_node *)1;
                goto src_skip;
            }

            LY_TREE_FOR(trg_parent->child, trg_child) {
                /* schema match, data match? */
                if (lyd_merge_node_equal(trg_child, src_elem)) {
                    if (trg_child->schema->nodetype & (LYS_LEAF | LYS_ANYDATA)) {
                        lyd_merge_node_update(trg_child, src_elem);
                    }
                    break;
                } else if (ly_errno) {
                    return EXIT_FAILURE;
                }
            }

            /* first prepare for the next iteration */
            src_elem_backup = src_elem;
            trg_parent_backup = trg_parent;
            if ((src_elem->schema->nodetype & (LYS_CONTAINER | LYS_LIST)) && src_elem->child && trg_child) {
                /* go into children */
                src_next = src_elem->child;
                trg_parent = trg_child;
            } else {
src_skip:
                /* no children (or the whole subtree will be inserted), try siblings */
                if (src_elem == src) {
                    /* we are done, src has no children ... */
                    if ((src_elem->schema->nodetype == LYS_CONTAINER)
                        || ((src_elem->schema->nodetype & (LYS_LEAF | LYS_ANYDATA)) && trg_child)) {
                        /* and it's a container (empty one) or an already-updated leaf/anydata, nothing else to do */
                        break;
                    } else {
                        /* ... but we still need to insert it */
                        src_next = NULL;
                        goto src_insert;
                    }
                } else {
                    src_next = src_elem->next;
                    /* trg_parent does not change */
                }
            }
            while (!src_next) {
                src_elem = src_elem->parent;
                if (src_elem->parent == src->parent) {
                    /* we are done, no next element to process */
                    break;
                }

                /* parent is already processed, go to its sibling */
                src_next = src_elem->next;
                trg_parent = trg_parent->parent;
            }

            if (!trg_child) {
src_insert:
                /* we need to insert the whole subtree */
                if (ctx == src_elem_backup->schema->module->ctx) {
                    /* same context - unlink the subtree and insert it into the target */
                    lyd_unlink(src_elem_backup);
                } else {
                    /* different contexts - before inserting subtree, instead of unlinking, duplicate it into the
                     * target context */
                    src_elem_backup = lyd_dup_to_ctx(src_elem_backup, 1, ctx);
                }

                /* insert subtree into the target */
                if (lyd_insert(trg_parent_backup, src_elem_backup)) {
                    LOGINT;
                    lyd_free_withsiblings(source);
                    return EXIT_FAILURE;
                }
                if (src_elem == src) {
                    /* we are finished for this src, we spent it, so forget the pointer if available */
                    if (source == src) {
                        source = source->next;
                    }
                    break;
                }
            }
        }
    }

    lyd_free_withsiblings(source);
    return EXIT_SUCCESS;
}